

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall Am_Value_List::Delete(Am_Value_List *this,bool unique)

{
  Am_List_Item *pAVar1;
  Am_List_Item *this_00;
  Am_List_Item *new_item;
  bool unique_local;
  Am_Value_List *this_local;
  
  if ((this->item != (Am_List_Item *)0x0) && (this->data != (Am_Value_List_Data *)0x0)) {
    if (unique) {
      Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
    }
    if (this->item->prev == (Am_List_Item *)0x0) {
      this->data->head = this->item->next;
    }
    else {
      this->item->prev->next = this->item->next;
    }
    if (this->item->next == (Am_List_Item *)0x0) {
      this->data->tail = this->item->prev;
    }
    else {
      this->item->next->prev = this->item->prev;
    }
    pAVar1 = this->item->prev;
    this_00 = this->item;
    if (this_00 != (Am_List_Item *)0x0) {
      Am_List_Item::~Am_List_Item(this_00);
      operator_delete(this_00);
    }
    this->item = pAVar1;
    *(short *)&(this->data->super_Am_Wrapper).field_0xc =
         *(short *)&(this->data->super_Am_Wrapper).field_0xc + -1;
    return;
  }
  Am_Error("** Am_Value_List::Delete: no item is current\n");
}

Assistant:

void
Am_Value_List::Delete(bool unique)
{
  if (item && data) {
    if (unique)
      data->Make_Unique(data, item);
    if (item->prev)
      item->prev->next = item->next;
    else
      data->head = item->next;
    if (item->next)
      item->next->prev = item->prev;
    else
      data->tail = item->prev;
    Am_List_Item *new_item;
    new_item = item->prev;
    delete item;
    item = new_item;
    --data->number;
  } else
    Am_Error("** Am_Value_List::Delete: no item is current\n");
}